

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

int Ver_ParseBox(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkBox)

{
  uint *puVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *pAVar10;
  Abc_Ntk_t *pAVar11;
  void *pvVar12;
  char *pcVar13;
  size_t sVar14;
  Vec_Ptr_t *pVVar15;
  char *pcVar16;
  int iVar17;
  long lVar18;
  Ver_Stream_t *p;
  char *__format;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int nLsb;
  int nMsb;
  uint Value;
  char Buffer [1000];
  uint local_464;
  uint local_460;
  char local_45a;
  char local_459;
  Abc_Obj_t *local_458;
  char *local_450;
  Abc_Ntk_t *local_448;
  Ver_Man_t *local_440;
  uint local_434;
  Ver_Stream_t *local_430;
  Abc_Ntk_t *local_428;
  Abc_Obj_t *local_420;
  char local_418 [1000];
  
  p = pMan->pReader;
  pcVar7 = Ver_ParseGetName(pMan);
  if (pcVar7 == (char *)0x0) {
    return 0;
  }
  local_428 = pNtk;
  pAVar8 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BLACKBOX);
  (pAVar8->field_5).pData = pNtkBox;
  Abc_ObjAssignName(pAVar8,pcVar7,(char *)0x0);
  cVar3 = Ver_StreamPopChar(p);
  if (cVar3 == '(') {
    Ver_ParseSkipComments(pMan);
    pAVar9 = (Abc_Obj_t *)malloc(0x10);
    pAVar9->pNtk = (Abc_Ntk_t *)0x10;
    pAVar10 = (Abc_Obj_t *)malloc(0x80);
    pAVar9->pNext = pAVar10;
    (pAVar8->field_6).pCopy = pAVar9;
    local_458 = pAVar8;
    local_440 = pMan;
    local_430 = p;
    local_420 = pAVar9;
LAB_002ff3a4:
    pAVar8 = local_420;
    pAVar11 = (Abc_Ntk_t *)malloc(0x10);
    pAVar11->ntkType = ABC_NTK_NONE;
    pAVar11->ntkFunc = ABC_FUNC_NONE;
    pcVar7 = (char *)malloc(0x10);
    pcVar7[0] = '\b';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    pvVar12 = malloc(0x40);
    *(void **)(pcVar7 + 8) = pvVar12;
    pAVar11->pName = pcVar7;
    uVar19 = *(uint *)&pAVar8->pNtk;
    local_448 = pAVar11;
    if (*(uint *)((long)&pAVar8->pNtk + 4) == uVar19) {
      if ((int)uVar19 < 0x10) {
        if (pAVar8->pNext == (Abc_Obj_t *)0x0) {
          pAVar9 = (Abc_Obj_t *)malloc(0x80);
        }
        else {
          pAVar9 = (Abc_Obj_t *)realloc(pAVar8->pNext,0x80);
        }
        iVar5 = 0x10;
      }
      else {
        iVar5 = uVar19 * 2;
        if (iVar5 <= (int)uVar19) goto LAB_002ff440;
        if (pAVar8->pNext == (Abc_Obj_t *)0x0) {
          pAVar9 = (Abc_Obj_t *)malloc((ulong)uVar19 << 4);
        }
        else {
          pAVar9 = (Abc_Obj_t *)realloc(pAVar8->pNext,(ulong)uVar19 << 4);
        }
      }
      pAVar8->pNext = pAVar9;
      *(int *)&pAVar8->pNtk = iVar5;
    }
LAB_002ff440:
    pAVar9 = pAVar8->pNext;
    iVar5 = *(int *)((long)&pAVar8->pNtk + 4);
    *(int *)((long)&pAVar8->pNtk + 4) = iVar5 + 1;
    (&pAVar9->pNtk)[iVar5] = local_448;
    cVar3 = Ver_StreamScanChar(p);
    if (cVar3 == '.') {
      cVar4 = Ver_StreamPopChar(p);
      if (cVar4 != '.') {
        pcVar7 = pMan->sError;
        pcVar13 = Abc_ObjName(local_458);
        pcVar16 = "Cannot parse box %s (expected .).";
        goto LAB_002ffcaa;
      }
      pcVar7 = Ver_ParseGetName(pMan);
      if (pcVar7 == (char *)0x0) {
        return 0;
      }
      pcVar13 = Extra_UtilStrsav(pcVar7);
      *(char **)local_448 = pcVar13;
      cVar4 = Ver_StreamPopChar(p);
      if (cVar4 != '(') {
        pcVar13 = pMan->sError;
        pcVar16 = Abc_ObjName(local_458);
        __format = "Cannot formal parameter %s of box %s (expected opening parenthesis).";
        goto LAB_002ffdc2;
      }
      Ver_ParseSkipComments(pMan);
    }
    pAVar11 = local_428;
    local_45a = cVar3;
    cVar3 = Ver_StreamScanChar(p);
    if (cVar3 == '{') {
      Ver_StreamPopChar(p);
      do {
        Ver_ParseSkipComments(pMan);
        pcVar7 = Ver_ParseGetName(pMan);
        if (pcVar7 == (char *)0x0) {
          return 0;
        }
        sVar14 = strlen(pcVar7);
        cVar3 = pcVar7[sVar14 - 1];
        if (cVar3 == '}') {
          pcVar7[sVar14 - 1] = '\0';
        }
        p = local_430;
        if (*pcVar7 == '\0') goto LAB_002ffc4d;
        local_459 = cVar3;
        local_450 = pcVar7;
        if ((byte)(*pcVar7 - 0x31U) < 9) {
          iVar5 = Ver_ParseConstant(pMan,pcVar7);
          if (iVar5 == 0) {
            return 0;
          }
          pVVar15 = pMan->vNames;
          if (0 < pVVar15->nSize) {
            lVar18 = 0;
            do {
              sprintf(local_418,"1\'b%d",(ulong)(pVVar15->pArray[lVar18] != (void *)0x0));
              pAVar8 = Ver_ParseFindNet(pAVar11,local_418);
              pMan = local_440;
              if (pAVar8 == (Abc_Obj_t *)0x0) {
                pcVar13 = local_440->sError;
                pcVar16 = Abc_ObjName(local_458);
                __format = "Actual net \"%s\" is missing in gate \"%s\".";
                pcVar7 = local_418;
                goto LAB_002ffdc2;
              }
              puVar1 = (uint *)local_448->pName;
              uVar19 = *puVar1;
              if (puVar1[1] == uVar19) {
                if ((int)uVar19 < 0x10) {
                  if (*(void **)(puVar1 + 2) == (void *)0x0) {
                    pvVar12 = malloc(0x80);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(puVar1 + 2),0x80);
                  }
                  *(void **)(puVar1 + 2) = pvVar12;
                  uVar21 = 0x10;
                }
                else {
                  uVar21 = uVar19 * 2;
                  if ((int)uVar21 <= (int)uVar19) goto LAB_002ff609;
                  if (*(void **)(puVar1 + 2) == (void *)0x0) {
                    pvVar12 = malloc((ulong)uVar19 << 4);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(puVar1 + 2),(ulong)uVar19 << 4);
                  }
                  *(void **)(puVar1 + 2) = pvVar12;
                }
                *puVar1 = uVar21;
              }
LAB_002ff609:
              uVar19 = puVar1[1];
              puVar1[1] = uVar19 + 1;
              *(Abc_Obj_t **)(*(long *)(puVar1 + 2) + (long)(int)uVar19 * 8) = pAVar8;
              lVar18 = lVar18 + 1;
              pVVar15 = local_440->vNames;
            } while (lVar18 < pVVar15->nSize);
          }
        }
        else {
          sVar14 = strlen(pcVar7);
          if ((pcVar7[sVar14 - 1] == ']') && (pMan->fNameLast == 0)) {
            Ver_ParseSignalSuffix(pMan,pcVar7,(int *)&local_460,(int *)&local_464);
          }
          else {
            local_464 = 0xffffffff;
            local_460 = 0xffffffff;
            if ((pMan->tName2Suffix != (st__table *)0x0) &&
               (iVar5 = st__lookup(pMan->tName2Suffix,pcVar7,(char **)&local_434), iVar5 != 0)) {
              local_460 = local_434 >> 8 & 0xff;
              local_464 = local_434 & 0xff;
            }
          }
          if ((local_460 & local_464) == 0xffffffff) {
            pAVar8 = Ver_ParseFindNet(pAVar11,pcVar7);
            if (pAVar8 == (Abc_Obj_t *)0x0) {
              iVar5 = strncmp(pcVar7,"Open_",5);
              if ((iVar5 != 0) && (iVar5 = strncmp(pcVar7,"dct_unconnected",0xf), iVar5 != 0))
              goto LAB_002ffce9;
              pAVar8 = Abc_NtkCreateObj(pAVar11,ABC_OBJ_NET);
            }
            puVar1 = (uint *)local_448->pName;
            uVar19 = *puVar1;
            if (puVar1[1] == uVar19) {
              if ((int)uVar19 < 0x10) {
                if (*(void **)(puVar1 + 2) == (void *)0x0) {
                  pvVar12 = malloc(0x80);
                }
                else {
                  pvVar12 = realloc(*(void **)(puVar1 + 2),0x80);
                }
                *(void **)(puVar1 + 2) = pvVar12;
                uVar21 = 0x10;
              }
              else {
                uVar21 = uVar19 * 2;
                if ((int)uVar21 <= (int)uVar19) goto LAB_002ff8e5;
                if (*(void **)(puVar1 + 2) == (void *)0x0) {
                  pvVar12 = malloc((ulong)uVar19 << 4);
                }
                else {
                  pvVar12 = realloc(*(void **)(puVar1 + 2),(ulong)uVar19 << 4);
                }
                *(void **)(puVar1 + 2) = pvVar12;
              }
              *puVar1 = uVar21;
            }
LAB_002ff8e5:
            uVar19 = puVar1[1];
            puVar1[1] = uVar19 + 1;
            *(Abc_Obj_t **)(*(long *)(puVar1 + 2) + (long)(int)uVar19 * 8) = pAVar8;
          }
          else {
            if (((int)local_460 < 0) || ((int)local_464 < 0)) {
              __assert_fail("nMsb >= 0 && nLsb >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/ver/verCore.c"
                            ,0x75c,"int Ver_ParseBox(Ver_Man_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
            }
            iVar17 = local_460 - local_464;
            bVar2 = (int)local_460 < (int)local_464;
            iVar5 = -iVar17;
            if (iVar5 == iVar17 || SBORROW4(iVar5,iVar17) != iVar17 * -2 < 0) {
              iVar5 = iVar17;
            }
            iVar5 = iVar5 + 1;
            uVar19 = local_460;
            do {
              sprintf(local_418,"%s[%d]",local_450,(ulong)uVar19);
              pAVar8 = Ver_ParseFindNet(pAVar11,local_418);
              pcVar7 = local_450;
              if (pAVar8 == (Abc_Obj_t *)0x0) {
                iVar6 = strncmp(local_450,"Open_",5);
                if ((iVar6 != 0) &&
                   (iVar6 = strncmp(pcVar7,"dct_unconnected",0xf), pMan = local_440, iVar6 != 0))
                goto LAB_002ffce9;
                pAVar8 = Abc_NtkCreateObj(pAVar11,ABC_OBJ_NET);
              }
              puVar1 = (uint *)local_448->pName;
              uVar21 = *puVar1;
              if (puVar1[1] == uVar21) {
                if ((int)uVar21 < 0x10) {
                  if (*(void **)(puVar1 + 2) == (void *)0x0) {
                    pvVar12 = malloc(0x80);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(puVar1 + 2),0x80);
                  }
                  *(void **)(puVar1 + 2) = pvVar12;
                  uVar20 = 0x10;
                }
                else {
                  uVar20 = uVar21 * 2;
                  if ((int)uVar20 <= (int)uVar21) goto LAB_002ff877;
                  if (*(void **)(puVar1 + 2) == (void *)0x0) {
                    pvVar12 = malloc((ulong)uVar21 << 4);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(puVar1 + 2),(ulong)uVar21 << 4);
                  }
                  *(void **)(puVar1 + 2) = pvVar12;
                }
                *puVar1 = uVar20;
              }
LAB_002ff877:
              uVar21 = puVar1[1];
              puVar1[1] = uVar21 + 1;
              *(Abc_Obj_t **)(*(long *)(puVar1 + 2) + (long)(int)uVar21 * 8) = pAVar8;
              uVar19 = uVar19 + (uint)(iVar17 == 0 || bVar2) * 2 + -1;
              iVar5 = iVar5 + -1;
              pAVar11 = local_428;
            } while (0 < iVar5);
          }
        }
        pMan = local_440;
        p = local_430;
        pcVar7 = local_450;
        if (local_459 == '}') goto LAB_002ffc4d;
        Ver_ParseSkipComments(local_440);
        p = local_430;
        cVar3 = Ver_StreamPopChar(local_430);
      } while (cVar3 == ',');
      pcVar7 = local_450;
      if (cVar3 != '}') {
        pcVar13 = pMan->sError;
        pcVar16 = Abc_ObjName(local_458);
        __format = "Cannot parse formal parameter %s of gate %s (expected comma).";
        pcVar7 = local_450;
        goto LAB_002ffdc2;
      }
    }
    else {
      pcVar7 = Ver_ParseGetName(pMan);
      if (pcVar7 == (char *)0x0) {
        return 0;
      }
      if (*pcVar7 == '\0') {
        pAVar8 = Abc_NtkCreateObj(pAVar11,ABC_OBJ_NET);
      }
      else {
        pAVar8 = Ver_ParseFindNet(pAVar11,pcVar7);
        if (pAVar8 == (Abc_Obj_t *)0x0) {
          local_464 = 0xffffffff;
          local_460 = 0xffffffff;
          if ((pMan->tName2Suffix != (st__table *)0x0) &&
             (iVar5 = st__lookup(pMan->tName2Suffix,pcVar7,(char **)&local_434), iVar5 != 0)) {
            local_460 = local_434 >> 8 & 0xff;
            local_464 = local_434 & 0xff;
          }
          if ((((local_460 == 0xffffffff) && (local_464 == 0xffffffff)) &&
              (Ver_ParseSignalSuffix(pMan,pcVar7,(int *)&local_460,(int *)&local_464),
              local_460 == 0xffffffff)) && (local_464 == 0xffffffff)) {
            iVar5 = strncmp(pcVar7,"Open_",5);
            if ((iVar5 == 0) || (iVar5 = strncmp(pcVar7,"dct_unconnected",0xf), iVar5 == 0)) {
              pAVar8 = Abc_NtkCreateObj(pAVar11,ABC_OBJ_NET);
              Vec_PtrPush((Vec_Ptr_t *)local_448->pName,pAVar8);
              goto LAB_002ffc4d;
            }
LAB_002ffce9:
            pcVar13 = pMan->sError;
            pcVar16 = Abc_ObjName(local_458);
            __format = "Actual net \"%s\" is missing in box \"%s\".";
            goto LAB_002ffdc2;
          }
          iVar17 = local_460 - local_464;
          bVar2 = (int)local_460 < (int)local_464;
          iVar5 = -iVar17;
          if (iVar5 == iVar17 || SBORROW4(iVar5,iVar17) != iVar17 * -2 < 0) {
            iVar5 = iVar17;
          }
          iVar5 = iVar5 + 1;
          uVar19 = local_460;
          local_450 = pcVar7;
          do {
            sprintf(local_418,"%s[%d]",local_450,(ulong)uVar19);
            pAVar8 = Ver_ParseFindNet(pAVar11,local_418);
            pcVar7 = local_450;
            if (pAVar8 == (Abc_Obj_t *)0x0) {
              iVar6 = strncmp(local_450,"Open_",5);
              if ((iVar6 != 0) &&
                 (iVar6 = strncmp(pcVar7,"dct_unconnected",0xf), pMan = local_440, iVar6 != 0))
              goto LAB_002ffce9;
              pAVar8 = Abc_NtkCreateObj(pAVar11,ABC_OBJ_NET);
            }
            puVar1 = (uint *)local_448->pName;
            uVar21 = *puVar1;
            if (puVar1[1] == uVar21) {
              if ((int)uVar21 < 0x10) {
                if (*(void **)(puVar1 + 2) == (void *)0x0) {
                  pvVar12 = malloc(0x80);
                }
                else {
                  pvVar12 = realloc(*(void **)(puVar1 + 2),0x80);
                }
                *(void **)(puVar1 + 2) = pvVar12;
                uVar20 = 0x10;
              }
              else {
                uVar20 = uVar21 * 2;
                if ((int)uVar20 <= (int)uVar21) goto LAB_002ffbcc;
                if (*(void **)(puVar1 + 2) == (void *)0x0) {
                  pvVar12 = malloc((ulong)uVar21 << 4);
                }
                else {
                  pvVar12 = realloc(*(void **)(puVar1 + 2),(ulong)uVar21 << 4);
                }
                *(void **)(puVar1 + 2) = pvVar12;
              }
              *puVar1 = uVar20;
            }
LAB_002ffbcc:
            uVar21 = puVar1[1];
            puVar1[1] = uVar21 + 1;
            *(Abc_Obj_t **)(*(long *)(puVar1 + 2) + (long)(int)uVar21 * 8) = pAVar8;
            uVar19 = uVar19 + (uint)(iVar17 == 0 || bVar2) * 2 + -1;
            iVar5 = iVar5 + -1;
            p = local_430;
            pMan = local_440;
            pAVar11 = local_428;
            pcVar7 = local_450;
          } while (0 < iVar5);
          goto LAB_002ffc4d;
        }
      }
      puVar1 = (uint *)local_448->pName;
      uVar19 = *puVar1;
      if (puVar1[1] == uVar19) {
        if ((int)uVar19 < 0x10) {
          if (*(void **)(puVar1 + 2) == (void *)0x0) {
            pvVar12 = malloc(0x80);
          }
          else {
            pvVar12 = realloc(*(void **)(puVar1 + 2),0x80);
          }
          *(void **)(puVar1 + 2) = pvVar12;
          uVar21 = 0x10;
        }
        else {
          uVar21 = uVar19 * 2;
          if ((int)uVar21 <= (int)uVar19) goto LAB_002ffc3b;
          if (*(void **)(puVar1 + 2) == (void *)0x0) {
            pvVar12 = malloc((ulong)uVar19 << 4);
          }
          else {
            pvVar12 = realloc(*(void **)(puVar1 + 2),(ulong)uVar19 << 4);
          }
          *(void **)(puVar1 + 2) = pvVar12;
        }
        *puVar1 = uVar21;
      }
LAB_002ffc3b:
      uVar19 = puVar1[1];
      puVar1[1] = uVar19 + 1;
      *(Abc_Obj_t **)(*(long *)(puVar1 + 2) + (long)(int)uVar19 * 8) = pAVar8;
    }
LAB_002ffc4d:
    if (local_45a == '.') {
      Ver_ParseSkipComments(pMan);
      cVar3 = Ver_StreamPopChar(p);
      if (cVar3 != ')') {
        pcVar13 = pMan->sError;
        pcVar16 = Abc_ObjName(local_458);
        __format = "Cannot parse formal parameter %s of box %s (expected closing parenthesis).";
        goto LAB_002ffdc2;
      }
      Ver_ParseSkipComments(pMan);
    }
    cVar3 = Ver_StreamPopChar(p);
    if (cVar3 != ',') goto LAB_002ffd0d;
    Ver_ParseSkipComments(pMan);
    goto LAB_002ff3a4;
  }
  pcVar7 = pMan->sError;
  pcVar13 = Abc_ObjName(pAVar8);
  pcVar16 = "Cannot parse box %s (expected opening parenthesis).";
LAB_002ffcaa:
  sprintf(pcVar7,pcVar16,pcVar13);
LAB_002ffdcc:
  Ver_ParsePrintErrorMessage(pMan);
  return 0;
LAB_002ffd0d:
  if (cVar3 != ')') {
    pcVar13 = pMan->sError;
    pcVar16 = Abc_ObjName(local_458);
    __format = "Cannot parse formal parameter %s of box %s (expected comma).";
LAB_002ffdc2:
    sprintf(pcVar13,__format,pcVar7,pcVar16);
    goto LAB_002ffdcc;
  }
  Ver_ParseSkipComments(pMan);
  cVar3 = Ver_StreamPopChar(p);
  if (cVar3 == ';') {
    return 1;
  }
  pcVar7 = pMan->sError;
  pcVar13 = Abc_ObjName(local_458);
  pcVar16 = "Cannot read box %s (expected closing semicolumn).";
  goto LAB_002ffcaa;
}

Assistant:

int Ver_ParseBox( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkBox )
{
    char Buffer[1000];
    Ver_Stream_t * p = pMan->pReader;
    Ver_Bundle_t * pBundle;
    Vec_Ptr_t * vBundles;
    Abc_Obj_t * pNetActual; 
    Abc_Obj_t * pNode;
    char * pWord, Symbol;
    int fCompl, fFormalIsGiven;
    int i, k, Bit, Limit, nMsb, nLsb, fQuit, flag;

    // gate the name of the box
    pWord = Ver_ParseGetName( pMan );
    if ( pWord == NULL )
        return 0;

    // create a box with this name
    pNode = Abc_NtkCreateBlackbox( pNtk );
    pNode->pData = pNtkBox;
    Abc_ObjAssignName( pNode, pWord, NULL );

    // continue parsing the box
    if ( Ver_StreamPopChar(p) != '(' )
    {
        sprintf( pMan->sError, "Cannot parse box %s (expected opening parenthesis).", Abc_ObjName(pNode) );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    Ver_ParseSkipComments( pMan );
 
    // parse pairs of formal/actual inputs
    vBundles = Vec_PtrAlloc( 16 );
    pNode->pCopy = (Abc_Obj_t *)vBundles;
    while ( 1 )
    {
        // allocate the bundle (formal name + array of actual nets)
        pBundle = ABC_ALLOC( Ver_Bundle_t, 1 );
        pBundle->pNameFormal = NULL;
        pBundle->vNetsActual = Vec_PtrAlloc( 4 );
        Vec_PtrPush( vBundles, pBundle );

        // process one pair of formal/actual parameters
        fFormalIsGiven = 0;
        if ( Ver_StreamScanChar(p) == '.' )
        {
            fFormalIsGiven = 1;
            if ( Ver_StreamPopChar(p) != '.' )
            {
                sprintf( pMan->sError, "Cannot parse box %s (expected .).", Abc_ObjName(pNode) );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }

            // parse the formal name
            pWord = Ver_ParseGetName( pMan );
            if ( pWord == NULL )
                return 0;

            // save the name
            pBundle->pNameFormal = Extra_UtilStrsav( pWord );

            // open the parenthesis
            if ( Ver_StreamPopChar(p) != '(' )
            {
                sprintf( pMan->sError, "Cannot formal parameter %s of box %s (expected opening parenthesis).", pWord, Abc_ObjName(pNode));
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            Ver_ParseSkipComments( pMan );
        }

        // check if this is the beginning of {} expression
        Symbol = Ver_StreamScanChar(p);

        // consider the case of vector-inputs
        if ( Symbol == '{' )
        {
            // skip this char
            Ver_StreamPopChar(p);

            // read actual names
            i = 0;
            fQuit = 0;
            while ( 1 )
            {
                // parse the formal name
                Ver_ParseSkipComments( pMan );
                pWord = Ver_ParseGetName( pMan );
                if ( pWord == NULL )
                    return 0;

                // check if the last char is a closing brace
                if ( pWord[strlen(pWord)-1] == '}' )
                {
                    pWord[strlen(pWord)-1] = 0;
                    fQuit = 1;
                }
                if ( pWord[0] == 0 )
                    break;

                // check for constant
                if ( pWord[0] >= '1' && pWord[0] <= '9' )
                {
                    if ( !Ver_ParseConstant( pMan, pWord ) )
                        return 0;
                    // add constant MSB to LSB
                    for ( k = 0; k < Vec_PtrSize(pMan->vNames); k++, i++ )
                    {
                        // get the actual net
                        sprintf( Buffer, "1\'b%d", (int)(Vec_PtrEntry(pMan->vNames,k) != NULL) );
                        pNetActual = Ver_ParseFindNet( pNtk, Buffer );
                        if ( pNetActual == NULL )
                        {
                            sprintf( pMan->sError, "Actual net \"%s\" is missing in gate \"%s\".", Buffer, Abc_ObjName(pNode) );
                            Ver_ParsePrintErrorMessage( pMan );
                            return 0;
                        }
                        Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                    }
                }
                else
                {
                    // get the suffix of the form [m:n]
                    if ( pWord[strlen(pWord)-1] == ']' && !pMan->fNameLast )
                        Ver_ParseSignalSuffix( pMan, pWord, &nMsb, &nLsb );
                    else
                        Ver_ParseLookupSuffix( pMan, pWord, &nMsb, &nLsb );

                    // generate signals
                    if ( nMsb == -1 && nLsb == -1 )
                    {
                        // get the actual net
                        pNetActual = Ver_ParseFindNet( pNtk, pWord );
                        if ( pNetActual == NULL )
                        {
                            if ( !strncmp(pWord, "Open_", 5) ||
                                !strncmp(pWord, "dct_unconnected", 15) ) 
                                pNetActual = Abc_NtkCreateNet( pNtk );
                            else
                            {
                                sprintf( pMan->sError, "Actual net \"%s\" is missing in box \"%s\".", pWord, Abc_ObjName(pNode) );
                                Ver_ParsePrintErrorMessage( pMan );
                                return 0;
                            }
                        }
                        Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                        i++;
                    }
                    else
                    {
                        // go from MSB to LSB
                        assert( nMsb >= 0 && nLsb >= 0 );
                        Limit = (nMsb > nLsb) ? nMsb - nLsb + 1: nLsb - nMsb + 1;  
                        for ( Bit = nMsb, k = Limit - 1; k >= 0; Bit = (nMsb > nLsb ? Bit - 1: Bit + 1), k--, i++ )
                        {
                            // get the actual net
                            sprintf( Buffer, "%s[%d]", pWord, Bit );
                            pNetActual = Ver_ParseFindNet( pNtk, Buffer );
                            if ( pNetActual == NULL )
                            {
                                if ( !strncmp(pWord, "Open_", 5) ||
                                    !strncmp(pWord, "dct_unconnected", 15) ) 
                                    pNetActual = Abc_NtkCreateNet( pNtk );
                                else
                                {
                                    sprintf( pMan->sError, "Actual net \"%s\" is missing in box \"%s\".", pWord, Abc_ObjName(pNode) );
                                    Ver_ParsePrintErrorMessage( pMan );
                                    return 0;
                                }
                            }
                            Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                        }
                    }
                }

                if ( fQuit )
                    break;

                // skip comma
                Ver_ParseSkipComments( pMan );
                Symbol = Ver_StreamPopChar(p);
                if ( Symbol == '}' )
                    break;
                if ( Symbol != ',' )
                {
                    sprintf( pMan->sError, "Cannot parse formal parameter %s of gate %s (expected comma).", pWord, Abc_ObjName(pNode) );
                    Ver_ParsePrintErrorMessage( pMan );
                    return 0;
                }
            }
        }
        else
        {
            // get the next word
            pWord = Ver_ParseGetName( pMan );
            if ( pWord == NULL )
                return 0;
            // consider the case of empty name
            fCompl = 0;
            if ( pWord[0] == 0 )
            {
                pNetActual = Abc_NtkCreateNet( pNtk );
		        Vec_PtrPush( pBundle->vNetsActual, Abc_ObjNotCond( pNetActual, fCompl ) );
            }
            else
            {
                // get the actual net
                flag=0;
                pNetActual = Ver_ParseFindNet( pNtk, pWord );
                if ( pNetActual == NULL ) 
                {
                    Ver_ParseLookupSuffix( pMan, pWord, &nMsb, &nLsb );
                    if ( nMsb == -1 && nLsb == -1 ) 
                    {
                        Ver_ParseSignalSuffix( pMan, pWord, &nMsb, &nLsb );
                        if ( nMsb == -1 && nLsb == -1 ) 
                        {
                            if ( !strncmp(pWord, "Open_", 5) ||
                                !strncmp(pWord, "dct_unconnected", 15) ) 
                            {
                                pNetActual = Abc_NtkCreateNet( pNtk );
                                Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                            } 
                            else 
                            {
                                sprintf( pMan->sError, "Actual net \"%s\" is missing in box \"%s\".", pWord, Abc_ObjName(pNode) );
                                Ver_ParsePrintErrorMessage( pMan );
                                return 0;
                            }
                        } 
                        else 
                        {
                            flag=1;
                        }
                    } 
                    else 
                    {
                        flag=1;
                    }
                    if (flag) 
                    {
                        Limit = (nMsb > nLsb) ? nMsb - nLsb + 1: nLsb - nMsb + 1;  
                        for ( Bit = nMsb, k = Limit - 1; k >= 0; Bit = (nMsb > nLsb ? Bit - 1: Bit + 1), k--)
                        {
                            // get the actual net
                            sprintf( Buffer, "%s[%d]", pWord, Bit );
                            pNetActual = Ver_ParseFindNet( pNtk, Buffer );
                            if ( pNetActual == NULL )
                            {
                                if ( !strncmp(pWord, "Open_", 5) ||
                                    !strncmp(pWord, "dct_unconnected", 15)) 
                                    pNetActual = Abc_NtkCreateNet( pNtk );
                                else
                                {
                                    sprintf( pMan->sError, "Actual net \"%s\" is missing in box \"%s\".", pWord, Abc_ObjName(pNode) );
                                    Ver_ParsePrintErrorMessage( pMan );
                                    return 0;
                                }
                            }
                            Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                        }
                    }
                } 
                else 
                {
                    Vec_PtrPush( pBundle->vNetsActual, Abc_ObjNotCond( pNetActual, fCompl ) );
                }
            }
        }

        if ( fFormalIsGiven )
        {
            // close the parenthesis
            Ver_ParseSkipComments( pMan );
            if ( Ver_StreamPopChar(p) != ')' )
            {
                sprintf( pMan->sError, "Cannot parse formal parameter %s of box %s (expected closing parenthesis).", pWord, Abc_ObjName(pNode) );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            Ver_ParseSkipComments( pMan );
        }

        // check if it is the end of gate
        Symbol = Ver_StreamPopChar(p);
        if ( Symbol == ')' )
            break;
        // skip comma
        if ( Symbol != ',' )
        {
            sprintf( pMan->sError, "Cannot parse formal parameter %s of box %s (expected comma).", pWord, Abc_ObjName(pNode) );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        Ver_ParseSkipComments( pMan );
    }

    // check if it is the end of gate
    Ver_ParseSkipComments( pMan );
    if ( Ver_StreamPopChar(p) != ';' )
    {
        sprintf( pMan->sError, "Cannot read box %s (expected closing semicolumn).", Abc_ObjName(pNode) );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    return 1;
}